

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
deleteOneWayReference
          (UA_Server *server,UA_Session *session,UA_Node *node,UA_DeleteReferencesItem *item)

{
  UA_Logger *pp_Var1;
  UA_NodeId *n2;
  UA_Logger p_Var2;
  size_t sVar3;
  void *__ptr;
  bool bVar4;
  UA_Boolean UVar5;
  bool bVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  long lVar10;
  UA_StatusCode UVar11;
  code *pcVar12;
  byte bVar13;
  
  bVar13 = 0;
  p_Var2 = (server->config).logger;
  lVar10 = (long)p_Var2 * 0x50;
  pcVar12 = p_Var2 + 1;
  bVar6 = false;
  do {
    lVar10 = lVar10 + -0x50;
    pcVar12 = pcVar12 + -1;
    if (pcVar12 == (code *)0x0) break;
    sVar3 = (server->config).buildInfo.productUri.length;
    UVar5 = UA_NodeId_equal((UA_NodeId *)&(session->clientDescription).applicationName.text.data,
                            (UA_NodeId *)(sVar3 + lVar10 + 0x20));
    bVar4 = true;
    if (UVar5) {
      n2 = (UA_NodeId *)(sVar3 + lVar10);
      UVar5 = UA_NodeId_equal((UA_NodeId *)&(session->clientDescription).productUri.data,n2);
      if (UVar5) {
        bVar4 = true;
        if ((char)(session->clientDescription).applicationName.text.length !=
            *(char *)(sVar3 + 0x18 + lVar10)) {
          deleteMembers_noInit(n2,UA_TYPES + 0x38);
          n2[2].identifier.string.data = (UA_Byte *)0x0;
          n2[3].namespaceIndex = 0;
          *(undefined2 *)&n2[3].field_0x2 = 0;
          n2[3].identifierType = UA_NODEIDTYPE_NUMERIC;
          n2[2].namespaceIndex = 0;
          *(undefined2 *)&n2[2].field_0x2 = 0;
          n2[2].identifierType = UA_NODEIDTYPE_NUMERIC;
          n2[2].identifier.string.length = 0;
          n2[1].identifier.string.length = 0;
          n2[1].identifier.string.data = (UA_Byte *)0x0;
          (n2->identifier).string.data = (UA_Byte *)0x0;
          n2[1].namespaceIndex = 0;
          *(undefined2 *)&n2[1].field_0x2 = 0;
          n2[1].identifierType = UA_NODEIDTYPE_NUMERIC;
          n2->namespaceIndex = 0;
          *(undefined2 *)&n2->field_0x2 = 0;
          n2->identifierType = UA_NODEIDTYPE_NUMERIC;
          (n2->identifier).string.length = 0;
          sVar3 = (server->config).buildInfo.productUri.length;
          puVar8 = (undefined8 *)(sVar3 + (long)(server->config).logger * 0x50 + -0x50);
          puVar9 = (undefined8 *)(sVar3 + lVar10);
          for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
            *puVar9 = *puVar8;
            puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
            puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
          }
          pp_Var1 = &(server->config).logger;
          *pp_Var1 = *pp_Var1 + -1;
          bVar6 = true;
          bVar4 = false;
        }
      }
      else {
        bVar4 = true;
      }
    }
  } while (bVar4);
  UVar11 = 0x40bc0000;
  if (bVar6) {
    UVar11 = 0;
    if (((server->config).logger == (UA_Logger)0x0) &&
       (__ptr = (void *)(server->config).buildInfo.productUri.length, UVar11 = 0,
       __ptr != (void *)0x0)) {
      free(__ptr);
      (server->config).buildInfo.productUri.length = 0;
    }
  }
  return UVar11;
}

Assistant:

static UA_StatusCode
deleteOneWayReference(UA_Server *server, UA_Session *session, UA_Node *node,
                      const UA_DeleteReferencesItem *item) {
    UA_Boolean edited = false;
    for(size_t i = node->referencesSize; i > 0; --i) {
        UA_ReferenceNode *ref = &node->references[i-1];
        if(!UA_NodeId_equal(&item->targetNodeId.nodeId, &ref->targetId.nodeId))
            continue;
        if(!UA_NodeId_equal(&item->referenceTypeId, &ref->referenceTypeId))
            continue;
        if(item->isForward == ref->isInverse)
            continue;
        UA_ReferenceNode_deleteMembers(ref);
        /* move the last entry to override the current position */
        node->references[i-1] = node->references[node->referencesSize-1];
        --node->referencesSize;
        edited = true;
        break;
    }
    if(!edited)
        return UA_STATUSCODE_UNCERTAINREFERENCENOTDELETED;
    /* we removed the last reference */
    if(node->referencesSize == 0 && node->references) {
        UA_free(node->references);
        node->references = NULL;
    }
    return UA_STATUSCODE_GOOD;;
}